

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::setDomainBC
          (Diffusion *this,array<amrex::LinOpBCType,_3UL> *mlmg_lobc,
          array<amrex::LinOpBCType,_3UL> *mlmg_hibc,int src_comp)

{
  int iVar1;
  bool bVar2;
  BCRec *pBVar3;
  Geometry *this_00;
  reference pvVar4;
  size_type in_RDI;
  int pbc;
  int idim;
  BCRec *bc;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int dir;
  
  amrex::AmrLevel::get_desc_lst();
  amrex::DescriptorList::operator[]
            ((DescriptorList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (int)(in_RDI >> 0x20));
  pBVar3 = amrex::StateDescriptor::getBC
                     ((StateDescriptor *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int)(in_RDI >> 0x20));
  for (dir = 0; dir < 3; dir = dir + 1) {
    this_00 = amrex::AmrMesh::Geom
                        ((AmrMesh *)CONCAT44(dir,in_stack_ffffffffffffffb0),(int)(in_RDI >> 0x20));
    bVar2 = amrex::Geometry::isPeriodic(this_00,dir);
    if (bVar2) {
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffb0),
                          in_RDI);
      *pvVar4 = Periodic;
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffb0),
                          in_RDI);
      *pvVar4 = Periodic;
    }
    else {
      iVar1 = pBVar3->bc[dir];
      if (iVar1 == 3) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,3),in_RDI);
        *pvVar4 = Dirichlet;
      }
      else if (((iVar1 == 2) || (iVar1 == 4)) || (iVar1 == 1)) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,iVar1),in_RDI);
        *pvVar4 = Neumann;
      }
      else if (iVar1 == -1) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,0xffffffff),in_RDI);
        *pvVar4 = reflect_odd;
      }
      else {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,iVar1),in_RDI);
        *pvVar4 = bogus;
      }
      in_stack_ffffffffffffffb0 = pBVar3->bc[dir + 3];
      if (in_stack_ffffffffffffffb0 == 3) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,3),in_RDI);
        *pvVar4 = Dirichlet;
      }
      else if (((in_stack_ffffffffffffffb0 == 2) || (in_stack_ffffffffffffffb0 == 4)) ||
              (in_stack_ffffffffffffffb0 == 1)) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_RDI);
        *pvVar4 = Neumann;
      }
      else if (in_stack_ffffffffffffffb0 == -1) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,0xffffffff),in_RDI);
        *pvVar4 = reflect_odd;
      }
      else {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_RDI);
        *pvVar4 = bogus;
      }
    }
  }
  return;
}

Assistant:

void
Diffusion::setDomainBC (std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_lobc,
                        std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_hibc,
                        int src_comp)
{
    const BCRec& bc = navier_stokes->get_desc_lst()[State_Type].getBC(src_comp);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(0).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else
        {
            int pbc = bc.lo(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_lobc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_lobc[idim] = LinOpBCType::bogus;
            }

            pbc = bc.hi(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_hibc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_hibc[idim] = LinOpBCType::bogus;
            }
        }
    }
}